

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O0

Matrix4x4 * __thiscall CS248::DynamicScene::SceneObject::getObjectToWorld(SceneObject *this)

{
  long in_RSI;
  Matrix4x4 *in_RDI;
  Matrix4x4 scaleXform;
  Matrix4x4 RZ;
  Matrix4x4 RY;
  Matrix4x4 RX;
  Matrix4x4 T;
  float deg2Rad;
  Matrix4x4 *objectToWorld;
  Vector3D *in_stack_fffffffffffffbc8;
  Matrix4x4 *in_stack_fffffffffffffbd0;
  Matrix4x4 *in_stack_fffffffffffffbd8;
  Axis in_stack_fffffffffffffc04;
  double in_stack_fffffffffffffc08;
  Vector3D local_2c8 [22];
  Vector3D local_b0 [6];
  undefined4 local_14;
  
  local_14 = 0x3c8efa35;
  Vector3D::Vector3D(local_b0,(Vector3D *)(in_RSI + 0x10));
  Matrix4x4::translation(in_stack_fffffffffffffbc8);
  Matrix4x4::rotation(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
  Matrix4x4::rotation(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
  Matrix4x4::rotation(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
  Vector3D::Vector3D(local_2c8,(Vector3D *)(in_RSI + 0x40));
  Matrix4x4::scaling(in_stack_fffffffffffffbc8);
  Matrix4x4::operator*(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Matrix4x4::operator*(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Matrix4x4::operator*(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Matrix4x4::operator*(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  return in_RDI;
}

Assistant:

Matrix4x4 getObjectToWorld() const {
   
        float deg2Rad = M_PI / 180.0;
    
        Matrix4x4 T = Matrix4x4::translation(position_);
        Matrix4x4 RX = Matrix4x4::rotation(rotation_.x * deg2Rad, Matrix4x4::Axis::X);
        Matrix4x4 RY = Matrix4x4::rotation(rotation_.y * deg2Rad, Matrix4x4::Axis::Y);
        Matrix4x4 RZ = Matrix4x4::rotation(rotation_.z * deg2Rad, Matrix4x4::Axis::Z);
        Matrix4x4 scaleXform = Matrix4x4::scaling(scale_);
    
        // object to world transformation
        Matrix4x4 objectToWorld = T * RX * RY * RZ * scaleXform;
        return objectToWorld;
    }